

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O3

void Opa_ManPerform(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  Opa_Man_t *p;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  Vec_Int_t *pVVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  size_t __size;
  int **ppiVar21;
  uint local_54;
  
  p = (Opa_Man_t *)calloc(1,0x28);
  p->pGia = pGia;
  pVVar13 = pGia->vCos;
  lVar20 = (long)pVVar13->nSize;
  uVar18 = lVar20 - pGia->nRegs;
  p_00 = (Vec_Int_t *)calloc(uVar18,0x10);
  p->pvParts = p_00;
  __size = (long)pGia->nObjs << 2;
  piVar7 = (int *)malloc(__size);
  memset(piVar7,0xff,__size);
  p->pId2Part = piVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  p->vFront = pVVar8;
  if (0 < (int)uVar18) {
    piVar9 = &pVVar8->nSize;
    lVar11 = 0;
    do {
      if ((int)lVar20 <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar19 = pVVar13->pArray[lVar11];
      if (((long)iVar19 < 0) || (pGia->nObjs <= iVar19)) goto LAB_00718392;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGia->pObjs + iVar19;
      Vec_IntPush(p_00,iVar19);
      pGVar1 = pGia->pObjs;
      if ((pGVar2 < pGVar1) || (pGVar1 + pGia->nObjs <= pGVar2)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar19 = (int)((long)pGVar2 - (long)pGVar1 >> 2) * -0x55555555;
      piVar7[iVar19] = (int)lVar11;
      Vec_IntPush(pVVar8,iVar19);
      lVar11 = lVar11 + 1;
      pVVar13 = pGia->vCos;
      lVar20 = (long)pVVar13->nSize;
      uVar18 = lVar20 - pGia->nRegs;
      p_00 = p_00 + 1;
    } while (lVar11 < (long)uVar18);
    local_54 = *piVar9;
    p->nParts = (int)uVar18;
    if (0 < (int)local_54) {
      uVar14 = 0;
      uVar6 = 0;
      do {
        iVar19 = pVVar8->pArray[uVar14];
        if (((long)iVar19 < 0) || (pGia->nObjs <= iVar19)) {
LAB_00718392:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = pGia->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        if (uVar14 == local_54) {
          uVar12 = uVar6 + 1;
          printf("%6d : %6d -> %6d\n",(ulong)uVar12,uVar14,uVar18 & 0xffffffff);
          local_54 = *piVar9;
          bVar5 = 0 < (int)uVar6;
          uVar6 = uVar12;
          if (bVar5) {
            printf("Groups %d: ",uVar18 & 0xffffffff);
            pGVar3 = p->pGia;
            iVar10 = pGVar3->nRegs;
            pVVar13 = pGVar3->vCos;
            uVar12 = pVVar13->nSize - iVar10;
            uVar18 = (ulong)uVar12;
            if (uVar12 != 0 && iVar10 <= pVVar13->nSize) {
              pVVar8 = p->pvParts;
              lVar20 = 0;
              do {
                uVar12 = pVVar8[lVar20].nSize;
                if ((ulong)uVar12 != 0) {
                  if ((int)uVar12 < 1) {
                    uVar15 = 0;
                  }
                  else {
                    uVar16 = 0;
                    uVar15 = 0;
                    do {
                      iVar10 = pVVar8[lVar20].pArray[uVar16];
                      if (((long)iVar10 < 0) || (pGVar3->nObjs <= iVar10)) goto LAB_00718392;
                      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
                      uVar4 = *(undefined8 *)(pGVar3->pObjs + iVar10);
                      uVar17 = (uint)uVar4;
                      uVar15 = (ulong)((int)uVar15 +
                                      (uint)(((~uVar17 & 0x1fffffff) != 0 && (int)uVar17 < 0) &&
                                            (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff) <
                                            (int)uVar18));
                      uVar16 = uVar16 + 1;
                    } while (uVar12 != uVar16);
                  }
                  printf("%d ",uVar15);
                  iVar10 = pGVar3->nRegs;
                  pVVar13 = pGVar3->vCos;
                }
                lVar20 = lVar20 + 1;
                uVar18 = (long)pVVar13->nSize - (long)iVar10;
              } while (lVar20 < (long)uVar18);
            }
            putchar(10);
          }
        }
        pGVar2 = pGVar2 + iVar19;
        iVar19 = (int)*(ulong *)pGVar2;
        uVar18 = *(ulong *)pGVar2 & 0x1fffffff;
        if (uVar18 == 0x1fffffff || iVar19 < 0) {
          if ((-1 < iVar19) || ((int)uVar18 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                          ,0xc5,"void Opa_ManPerform(Gia_Man_t *)");
          }
        }
        else {
          Opa_ManMoveOne(p,pGVar2,pGVar2 + -uVar18);
          uVar18 = (ulong)(*(uint *)&pGVar2->field_0x4 & 0x1fffffff);
        }
        Opa_ManMoveOne(p,pGVar2,pGVar2 + -uVar18);
        uVar18 = (ulong)(uint)p->nParts;
        if ((p->nParts == 1) || (uVar6 == 5)) break;
        uVar14 = uVar14 + 1;
        pVVar8 = p->vFront;
        piVar9 = &pVVar8->nSize;
        if ((long)pVVar8->nSize <= (long)uVar14) break;
      } while( true );
    }
  }
  putchar(10);
  pVVar13 = p->vFront;
  piVar7 = pVVar13->pArray;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(pVVar13);
  pGVar3 = p->pGia;
  pVVar13 = p->pvParts;
  iVar19 = pGVar3->nRegs;
  pVVar8 = pGVar3->vCos;
  if (iVar19 < pVVar8->nSize) {
    ppiVar21 = &pVVar13->pArray;
    lVar20 = 0;
    do {
      if (*ppiVar21 != (int *)0x0) {
        free(*ppiVar21);
        *ppiVar21 = (int *)0x0;
        iVar19 = pGVar3->nRegs;
        pVVar8 = pGVar3->vCos;
      }
      lVar20 = lVar20 + 1;
      ppiVar21 = ppiVar21 + 2;
    } while (lVar20 < (long)pVVar8->nSize - (long)iVar19);
  }
  else if (pVVar13 == (Vec_Int_t *)0x0) goto LAB_0071836a;
  free(pVVar13);
LAB_0071836a:
  if (p->pId2Part != (int *)0x0) {
    free(p->pId2Part);
  }
  free(p);
  return;
}

Assistant:

void Opa_ManPerform( Gia_Man_t * pGia )
{
    Opa_Man_t * p;
    Gia_Obj_t * pObj;
    int i, Limit, Count = 0;
 
    p = Opa_ManStart( pGia );
    Limit = Vec_IntSize(p->vFront);
//Opa_ManPrint2( p );
    Gia_ManForEachObjVec( p->vFront, pGia, pObj, i )
    {
        if ( i == Limit )
        {
            printf( "%6d : %6d -> %6d\n", ++Count, i, p->nParts );
            Limit = Vec_IntSize(p->vFront);
            if ( Count > 1 )
                Opa_ManPrint2( p );
        }
//        printf( "*** Object %d  ", Gia_ObjId(pGia, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin1(pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
        else assert( 0 );
//        if ( i % 10 == 0 )
//            printf( "%d   ", p->nParts );
        if ( p->nParts == 1 )
            break;
        if ( Count == 5 )
            break;
    }
    printf( "\n" );
    Opa_ManStop( p );
}